

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O2

bool trun::caseMatch(string *caseName,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *caseList)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> negTC;
  
  __str = (caseList->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (caseList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  bVar5 = false;
  do {
    if (__str == pbVar1) {
      return bVar5;
    }
    std::__cxx11::string::string((string *)&tc,__str);
    bVar4 = std::operator==(&tc,"-");
    bVar3 = bVar2;
    if (!bVar4) {
      bVar3 = bVar5;
      if (*tc._M_dataplus._M_p == '!') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&negTC,&tc,1,0xffffffffffffffff);
        bVar5 = match(caseName,&negTC);
        std::__cxx11::string::~string((string *)&negTC);
        if (bVar5) {
          bVar2 = false;
LAB_00107a06:
          std::__cxx11::string::~string((string *)&tc);
          return bVar2;
        }
      }
      else {
        bVar5 = match(caseName,&tc);
        if (bVar5) goto LAB_00107a06;
      }
    }
    std::__cxx11::string::~string((string *)&tc);
    __str = __str + 1;
    bVar5 = bVar3;
  } while( true );
}

Assistant:

bool caseMatch(const std::string &caseName, const std::vector<std::string> &caseList) {
        int executeFlag = 0;
        for (auto tc: caseList) {
            if (tc == "-") {
                executeFlag = 1;
                continue;
            }
            if (tc[0]=='!') {
                auto negTC = tc.substr(1);
                auto isMatch = trun::match(caseName, negTC);
                if (isMatch) {
                    executeFlag = 0;
                    goto leave;
                }
            } else {
                auto isMatch = trun::match(caseName, tc);
                if (isMatch) {
                    executeFlag = 1;
                    goto leave;
                }
            }
        }
        leave:
            return executeFlag?true:false;
    }